

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

QString * runCommandAsUserArgs(QString *cmd)

{
  QAnyStringView s;
  QAnyStringView s_00;
  QAnyStringView s_01;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar1;
  QAnyStringView QVar2;
  ArgBase *argBases [4];
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar3;
  QAnyStringView *in_stack_fffffffffffffe98;
  QString *str;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_fffffffffffffea0;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this;
  char *in_stack_fffffffffffffea8;
  undefined1 *puVar4;
  qsizetype local_f0;
  char *pcStack_e8;
  undefined1 local_d0 [40];
  undefined1 local_a8 [40];
  QString local_80;
  qsizetype local_68;
  char *pcStack_60;
  size_t local_58;
  ulong local_50;
  size_t local_48;
  ulong uStack_40;
  size_t local_38;
  ulong uStack_30;
  QString *local_28;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aStack_20;
  undefined1 *local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  aVar3 = in_RDI;
  QVar1 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffffe98,(size_t)in_RDI);
  local_f0 = QVar1.m_size;
  local_68 = local_f0;
  pcStack_e8 = QVar1.m_data;
  pcStack_60 = pcStack_e8;
  QVar1.m_data = in_stack_fffffffffffffea8;
  QVar1.m_size = (qsizetype)in_stack_fffffffffffffea0.m_data;
  QAnyStringView::QAnyStringView(in_stack_fffffffffffffe98,QVar1);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffffea0.m_data,(QString *)in_stack_fffffffffffffe98
            );
  str = &local_80;
  s.m_size = (size_t)in_stack_fffffffffffffea8;
  s.field_0.m_data = in_stack_fffffffffffffea0.m_data;
  QtPrivate::qStringLikeToArg(s);
  QAnyStringView::QAnyStringView((QAnyStringView *)in_stack_fffffffffffffea0.m_data,str);
  this.m_data = local_a8;
  s_00.m_size = (size_t)in_stack_fffffffffffffea8;
  s_00.field_0.m_data = this.m_data;
  QtPrivate::qStringLikeToArg(s_00);
  QAnyStringView::QAnyStringView((QAnyStringView *)this.m_data,str);
  puVar4 = local_d0;
  s_01.m_size = (size_t)puVar4;
  s_01.field_0.m_data = this.m_data;
  QtPrivate::qStringLikeToArg(s_01);
  local_38 = local_58;
  uStack_30 = local_50;
  uStack_10 = 0;
  local_48 = local_58;
  uStack_40 = local_50;
  QVar2.m_size = local_58;
  QVar2.field_0.m_data = in_RDI.m_data;
  local_28 = str;
  aStack_20 = this;
  local_18 = puVar4;
  QtPrivate::argToQString(QVar2,local_50,(ArgBase **)0x3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)aVar3.m_data;
  }
  __stack_chk_fail();
}

Assistant:

static QString runCommandAsUserArgs(const QString &cmd)
{
    return "run-as %1 --user %2 %3"_L1.arg(g_options.package, g_testInfo.userId, cmd);
}